

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

PatchList re2::PatchList::Deref(Inst *inst0,PatchList l)

{
  Inst *ip;
  Inst *inst0_local;
  PatchList l_local;
  
  if ((l.p & 1) == 0) {
    inst0_local._0_4_ = Prog::Inst::out(inst0 + (l.p >> 1));
  }
  else {
    inst0_local._0_4_ = Prog::Inst::out1(inst0 + (l.p >> 1));
  }
  return (PatchList)(uint32)inst0_local;
}

Assistant:

PatchList PatchList::Deref(Prog::Inst* inst0, PatchList l) {
  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    l.p = ip->out1();
  else
    l.p = ip->out();
  return l;
}